

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O0

void __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::push_back(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
            *this,range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *r)

{
  size_type sVar1;
  bool bVar2;
  edges_collection_const_iterator_t *peVar3;
  size_type sVar4;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *r_local;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
  *this_local;
  
  this->_nranges = this->_nranges + 1;
  peVar3 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin(r);
  std::
  vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ::push_back(&this->_begins,peVar3);
  peVar3 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end(r);
  std::
  vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ::push_back(&this->_ends,peVar3);
  peVar3 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin(r);
  std::
  vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
  ::push_back(&this->_its,peVar3);
  bVar2 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
          ::empty(r);
  if (bVar2) {
    to_end(this);
  }
  sVar1 = this->_nranges;
  sVar4 = std::
          vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
          ::size(&this->_begins);
  if (sVar1 != sVar4) {
    __assert_fail("_nranges == _begins.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1fd,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  sVar1 = this->_nranges;
  sVar4 = std::
          vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
          ::size(&this->_ends);
  if (sVar1 != sVar4) {
    __assert_fail("_nranges == _ends.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1fe,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  sVar1 = this->_nranges;
  sVar4 = std::
          vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
          ::size(&this->_its);
  if (sVar1 != sVar4) {
    __assert_fail("_nranges == _its.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1ff,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  return;
}

Assistant:

void push_back(R const & r)
  {
    ++_nranges;
    _begins.push_back(r.begin());
    _ends.push_back(r.end());
    _its.push_back(r.begin());

    if (r.empty()) // detect empty cartesian product
      to_end();

    assert(_nranges == _begins.size());
    assert(_nranges == _ends.size());
    assert(_nranges == _its.size());
  }